

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O3

bool absl::cord_internal::CordRepBtree::IsValid(CordRepBtree *tree,bool shallow)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  long *plVar5;
  CordRepBtree *tree_00;
  bool bVar6;
  Nonnull<char_*> pcVar7;
  int line;
  uint64_t i;
  char *pcVar8;
  ulong uVar9;
  long lVar10;
  bool bVar11;
  long *local_d0 [2];
  long local_c0 [2];
  long *local_b0 [2];
  long local_a0 [2];
  long local_90;
  Nonnull<char_*> local_88;
  char local_80 [32];
  long local_60;
  Nonnull<char_*> local_58;
  char local_50 [32];
  
  if (tree == (CordRepBtree *)0x0) {
    pcVar8 = "tree != nullptr";
    line = 0x1bb;
  }
  else if ((tree->super_CordRep).tag == '\x03') {
    bVar1 = (tree->super_CordRep).storage[0];
    if (bVar1 < 0xc) {
      bVar2 = (tree->super_CordRep).storage[1];
      if (bVar2 < 6) {
        bVar3 = (tree->super_CordRep).storage[2];
        if ((ulong)bVar3 < 7) {
          if (bVar2 <= bVar3) {
            if (bVar2 == bVar3) {
              i = 0;
            }
            else {
              uVar9 = (ulong)((uint)bVar2 * 8);
              i = 0;
              do {
                plVar5 = *(long **)((long)tree->edges_ + uVar9);
                if (plVar5 == (long *)0x0) {
                  pcVar8 = "edge != nullptr";
                  line = 0x1c3;
                  goto LAB_00139fb9;
                }
                bVar4 = *(byte *)((long)plVar5 + 0xc);
                if (bVar1 == 0) {
                  if ((bVar4 < 5) && ((bVar4 != 1 || (*(byte *)(plVar5[3] + 0xc) < 5)))) {
                    pcVar8 = "IsDataEdge(edge)";
                    line = 0x1c8;
                    goto LAB_00139fb9;
                  }
                }
                else {
                  if (bVar4 != 3) {
                    pcVar8 = "edge->IsBtree()";
                    line = 0x1c5;
                    goto LAB_00139fb9;
                  }
                  if (bVar1 - 1 != (uint)*(byte *)((long)plVar5 + 0xd)) {
                    pcVar8 = "edge->btree()->height() == tree->height() - 1";
                    line = 0x1c6;
                    goto LAB_00139fb9;
                  }
                }
                i = i + *plVar5;
                uVar9 = uVar9 + 8;
              } while ((uint)bVar3 * 8 != uVar9);
            }
            if (i != (tree->super_CordRep).length) {
              pcVar7 = numbers_internal::FastIntToBuffer(i,local_50);
              local_60 = (long)pcVar7 - (long)local_50;
              local_d0[0] = local_c0;
              local_58 = local_50;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,local_50,pcVar7);
              plVar5 = local_d0[0];
              pcVar7 = numbers_internal::FastIntToBuffer((tree->super_CordRep).length,local_80);
              local_90 = (long)pcVar7 - (long)local_80;
              local_b0[0] = local_a0;
              local_88 = local_80;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,local_80,pcVar7);
              raw_log_internal::RawLog
                        (kError,"cord_rep_btree.cc",0x1cc,
                         "CordRepBtree::CheckValid() FAILED: %s != %s (%s vs %s)","child_length",
                         "tree->length",plVar5,local_b0[0]);
              if (local_b0[0] != local_a0) {
                operator_delete(local_b0[0],local_a0[0] + 1);
              }
              if (local_d0[0] != local_c0) {
                operator_delete(local_d0[0],local_c0[0] + 1);
              }
              return false;
            }
            if (shallow) {
              if (bVar1 == 0) {
                return true;
              }
              bVar1 = _ZN4absl13cord_internal12_GLOBAL__N_132cord_btree_exhaustive_validationE_0 & 1
              ;
            }
            if (bVar1 == 0) {
              return true;
            }
            if (bVar2 == bVar3) {
              return true;
            }
            lVar10 = (ulong)bVar2 << 3;
            while( true ) {
              tree_00 = *(CordRepBtree **)((long)tree->edges_ + lVar10);
              if ((tree_00->super_CordRep).tag != '\x03') {
                __assert_fail("IsBtree()",
                              "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                              ,599,"CordRepBtree *absl::cord_internal::CordRep::btree()");
              }
              bVar6 = IsValid(tree_00,shallow);
              if (!bVar6) break;
              bVar11 = (ulong)bVar3 * 8 + -8 == lVar10;
              lVar10 = lVar10 + 8;
              if (bVar11) {
                return bVar6;
              }
            }
            return bVar6;
          }
          pcVar8 = "tree->begin() <= tree->end()";
          line = 0x1c0;
        }
        else {
          pcVar8 = "tree->end() <= tree->capacity()";
          line = 0x1bf;
        }
      }
      else {
        pcVar8 = "tree->begin() < tree->capacity()";
        line = 0x1be;
      }
    }
    else {
      pcVar8 = "tree->height() <= kMaxHeight";
      line = 0x1bd;
    }
  }
  else {
    pcVar8 = "tree->IsBtree()";
    line = 0x1bc;
  }
LAB_00139fb9:
  raw_log_internal::RawLog
            (kError,"cord_rep_btree.cc",line,"CordRepBtree::CheckValid() FAILED: %s",pcVar8);
  return false;
}

Assistant:

bool CordRepBtree::IsValid(const CordRepBtree* tree, bool shallow) {
#define NODE_CHECK_VALID(x)                                           \
  if (!(x)) {                                                         \
    ABSL_RAW_LOG(ERROR, "CordRepBtree::CheckValid() FAILED: %s", #x); \
    return false;                                                     \
  }
#define NODE_CHECK_EQ(x, y)                                                    \
  if ((x) != (y)) {                                                            \
    ABSL_RAW_LOG(ERROR,                                                        \
                 "CordRepBtree::CheckValid() FAILED: %s != %s (%s vs %s)", #x, \
                 #y, absl::StrCat(x).c_str(), absl::StrCat(y).c_str());        \
    return false;                                                              \
  }

  NODE_CHECK_VALID(tree != nullptr);
  NODE_CHECK_VALID(tree->IsBtree());
  NODE_CHECK_VALID(tree->height() <= kMaxHeight);
  NODE_CHECK_VALID(tree->begin() < tree->capacity());
  NODE_CHECK_VALID(tree->end() <= tree->capacity());
  NODE_CHECK_VALID(tree->begin() <= tree->end());
  size_t child_length = 0;
  for (CordRep* edge : tree->Edges()) {
    NODE_CHECK_VALID(edge != nullptr);
    if (tree->height() > 0) {
      NODE_CHECK_VALID(edge->IsBtree());
      NODE_CHECK_VALID(edge->btree()->height() == tree->height() - 1);
    } else {
      NODE_CHECK_VALID(IsDataEdge(edge));
    }
    child_length += edge->length;
  }
  NODE_CHECK_EQ(child_length, tree->length);
  if ((!shallow || IsCordBtreeExhaustiveValidationEnabled()) &&
      tree->height() > 0) {
    for (CordRep* edge : tree->Edges()) {
      if (!IsValid(edge->btree(), shallow)) return false;
    }
  }
  return true;

#undef NODE_CHECK_VALID
#undef NODE_CHECK_EQ
}